

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommand.h
# Opt level: O2

void __thiscall cmCoreTryCompile::cmCoreTryCompile(cmCoreTryCompile *this)

{
  (this->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (this->super_cmCommand).Error._M_dataplus._M_p = (pointer)&(this->super_cmCommand).Error.field_2;
  (this->super_cmCommand).Error._M_string_length = 0;
  (this->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmCoreTryCompile_005cc7b8;
  (this->BinaryDirectory)._M_dataplus._M_p = (pointer)&(this->BinaryDirectory).field_2;
  (this->BinaryDirectory)._M_string_length = 0;
  (this->BinaryDirectory).field_2._M_local_buf[0] = '\0';
  (this->OutputFile)._M_dataplus._M_p = (pointer)&(this->OutputFile).field_2;
  (this->OutputFile)._M_string_length = 0;
  (this->OutputFile).field_2._M_local_buf[0] = '\0';
  (this->FindErrorMessage)._M_dataplus._M_p = (pointer)&(this->FindErrorMessage).field_2;
  (this->FindErrorMessage)._M_string_length = 0;
  (this->FindErrorMessage).field_2._M_local_buf[0] = '\0';
  this->SrcFileSignature = false;
  (this->WarnCMP0067).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->WarnCMP0067).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->WarnCMP0067).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

cmCommand() = default;